

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VocabularyTest.cpp
# Opt level: O2

void __thiscall
vocabulary_test_content_check_Test::vocabulary_test_content_check_Test
          (vocabulary_test_content_check_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00147c50;
  return;
}

Assistant:

TEST(vocabulary_test, content_check) {
    vector<string> words;
    unordered_set<string> source_words;
    for (int i = 0; i < 10000; i++) {
        string word;
        for (int j = 0; j < 3; j++)
            word.push_back(char('a' + prng() % 26));
        words.push_back(word);
        source_words.insert(word);
    }

    Vocabulary<string> vocab(words);
    Vocabulary<string> vocab2;
    vocab2.loads(vocab.dumps());
    unordered_set<string> target_words;
    for (string word : vocab2)
        target_words.insert(word);

    ASSERT_TRUE(source_words == target_words);
}